

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Room.cpp
# Opt level: O3

void __thiscall Room::parseData(Room *this)

{
  int iVar1;
  char cVar2;
  int iVar3;
  istream *piVar4;
  int iVar5;
  string line;
  ifstream myfile;
  undefined1 *local_258;
  undefined8 local_250;
  undefined1 local_248 [16];
  long local_238 [65];
  
  std::ifstream::ifstream((istream *)local_238,(string *)&this->roomName,_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    local_258 = local_248;
    local_250 = 0;
    local_248[0] = 0;
    iVar1 = 0;
    while( true ) {
      iVar5 = iVar1;
      cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_258,cVar2);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      iVar3 = std::__cxx11::string::compare((char *)&local_258);
      iVar1 = 1;
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::string::compare((char *)&local_258);
        iVar1 = 2;
        if (iVar3 != 0) {
          if (iVar5 == 1) {
            std::__cxx11::string::_M_append((char *)&this->rstate1,(ulong)local_258);
            std::__cxx11::string::append((char *)&this->rstate1);
            iVar1 = 1;
          }
          else if (iVar5 == 0) {
            std::__cxx11::string::_M_append((char *)&this->rstate0,(ulong)local_258);
            std::__cxx11::string::append((char *)&this->rstate0);
            iVar1 = 0;
          }
          else {
            std::__cxx11::string::_M_append((char *)&this->rstate2,(ulong)local_258);
            std::__cxx11::string::append((char *)&this->rstate2);
          }
        }
      }
    }
    if (local_258 != local_248) {
      operator_delete(local_258);
    }
  }
  std::ifstream::close();
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void Room::parseData() {
    std::ifstream myfile(roomName);
    description description = ROOM_STATE_0;
    if (myfile.is_open()) {
        std::string line;
        while (getline(myfile, line)) {
            if (line == "#ROOM_STATE_1#") {
                description = ROOM_STATE_1;
            } else if (line == "#ROOM_STATE_2#") {
                description = ROOM_STATE_2;
            } else if (description == ROOM_STATE_0) {
                rstate0 += line;
                rstate0 += "\n";
            } else if (description == ROOM_STATE_1) {
                rstate1 += line;
                rstate1 += "\n";
            } else if(description == ROOM_STATE_2) {
                rstate2 += line;
                rstate2 += "\n";
            }
        }
    }
    myfile.close();
}